

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O2

bool HasTestOption(ArgsManager *args,string *test_option)

{
  __type_conflict1 _Var1;
  pointer __lhs;
  long lVar2;
  long lVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  long in_FS_OFFSET;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  options;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"-test",(allocator<char> *)&local_78);
  ArgsManager::GetArgs(&local_110,args,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string((string *)&local_f8,test_option);
  std::__cxx11::string::string((string *)&local_d8,&local_f8);
  std::__cxx11::string::string((string *)&local_b8,&local_d8);
  std::__cxx11::string::string((string *)&local_98,&local_b8);
  std::__cxx11::string::string((string *)&local_58,&local_98);
  std::__cxx11::string::string((string *)&local_78,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string((string *)&local_58,&local_78);
  lVar3 = (long)local_110.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_110.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  __lhs = local_110.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  for (lVar2 = lVar3 >> 7; 0 < lVar2; lVar2 = lVar2 + -1) {
    _Var1 = std::operator==(__lhs,&local_58);
    pbVar4 = __lhs;
    if (_Var1) goto LAB_001173db;
    _Var1 = std::operator==(__lhs + 1,&local_58);
    pbVar4 = __lhs + 1;
    if (_Var1) goto LAB_001173db;
    _Var1 = std::operator==(__lhs + 2,&local_58);
    pbVar4 = __lhs + 2;
    if (_Var1) goto LAB_001173db;
    _Var1 = std::operator==(__lhs + 3,&local_58);
    pbVar4 = __lhs + 3;
    if (_Var1) goto LAB_001173db;
    __lhs = __lhs + 4;
    lVar3 = lVar3 + -0x80;
  }
  lVar3 = lVar3 >> 5;
  if (lVar3 != 1) {
    if (lVar3 != 2) {
      pbVar4 = local_110.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((lVar3 != 3) || (_Var1 = std::operator==(__lhs,&local_58), pbVar4 = __lhs, _Var1))
      goto LAB_001173db;
      __lhs = __lhs + 1;
    }
    _Var1 = std::operator==(__lhs,&local_58);
    pbVar4 = __lhs;
    if (_Var1) goto LAB_001173db;
    __lhs = __lhs + 1;
  }
  _Var1 = std::operator==(__lhs,&local_58);
  pbVar4 = __lhs;
  if (!_Var1) {
    pbVar4 = local_110.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
LAB_001173db:
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_110);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return pbVar4 != local_110.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
}

Assistant:

bool HasTestOption(const ArgsManager& args, const std::string& test_option)
{
    const auto options = args.GetArgs("-test");
    return std::any_of(options.begin(), options.end(), [test_option](const auto& option) {
        return option == test_option;
    });
}